

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_step_t
bsc_allgather_single(bsc_step_t depends,bsc_group_t group,void *src,void *dst,bsc_size_t size)

{
  uint uVar1;
  ulong uVar2;
  bsc_pid_t src_pid;
  ulong uVar3;
  
  if (group == (bsc_group_t)0x0) {
    uVar1 = bsp_nprocs();
  }
  else {
    uVar1 = *group;
  }
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    if (group == (bsc_group_t)0x0) {
      src_pid = (bsc_pid_t)uVar3;
    }
    else {
      src_pid = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + uVar3 * 4);
    }
    bsc_get(depends,src_pid,src,0,dst,size);
    dst = (void *)((long)dst + (long)size);
  }
  return depends + 1;
}

Assistant:

bsc_step_t bsc_allgather_single( bsc_step_t depends, bsc_group_t group,
                        const void * src, void * dst, bsc_size_t size )
{
    const group_t * g = group;
    bsc_pid_t i, P = g?g->size:bsp_nprocs() ;
    for ( i = 0; i < P; ++i ) {
        char * dst_bytes = dst;
        bsc_get( depends, g?g->gid[i]:i, src, 0, dst_bytes + i * size, size );
    }
    return depends + 1;
}